

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O2

void __thiscall
FIX::Message::setGroup
          (Message *this,string *msg,FieldBase *field,string *string,size_type *pos,FieldMap *map,
          DataDictionary *dataDictionary)

{
  int field_00;
  ulong uVar1;
  int delim_00;
  int field_01;
  bool bVar2;
  Group *pGroup;
  message_order *order;
  int delim;
  DataDictionary *pDD;
  FieldMap *local_a0;
  Message *local_98;
  string *local_90;
  FieldBase field_1;
  
  field_00 = field->m_tag;
  pDD = (DataDictionary *)0x0;
  local_a0 = map;
  local_98 = this;
  local_90 = msg;
  bVar2 = DataDictionary::getGroup(dataDictionary,msg,field_00,&delim,&pDD);
  if (bVar2) {
    pGroup = (Group *)0x0;
    while (uVar1 = *pos, uVar1 < string->_M_string_length) {
      extractField(&field_1,local_98,string,pos,dataDictionary,dataDictionary,pGroup);
      if (field_1.m_tag == delim) {
        if (pGroup != (Group *)0x0) {
LAB_00197347:
          FieldMap::addGroupPtr(local_a0,field_00,&pGroup->super_FieldMap,false);
        }
LAB_0019735d:
        pGroup = (Group *)operator_new(0x78);
        field_01 = field_1.m_tag;
        delim_00 = delim;
        order = DataDictionary::getOrderedFields(pDD);
        Group::Group(pGroup,field_01,delim_00,order);
      }
      else {
        bVar2 = DataDictionary::isField(pDD,field_1.m_tag);
        if (bVar2) {
          if (pGroup == (Group *)0x0) goto LAB_0019735d;
          bVar2 = FieldMap::isSetField(&pGroup->super_FieldMap,field_1.m_tag);
          if (bVar2) goto LAB_00197347;
        }
        bVar2 = DataDictionary::isField(pDD,field_1.m_tag);
        if (!bVar2) {
          if (pGroup != (Group *)0x0) {
            FieldMap::addGroupPtr(local_a0,field_00,&pGroup->super_FieldMap,false);
          }
          *pos = uVar1;
LAB_00197437:
          FieldBase::~FieldBase(&field_1);
          return;
        }
        if (pGroup == (Group *)0x0) goto LAB_00197437;
      }
      FieldMap::addField(&pGroup->super_FieldMap,&field_1);
      setGroup(local_98,local_90,&field_1,string,pos,&pGroup->super_FieldMap,pDD);
      FieldBase::~FieldBase(&field_1);
    }
    if (pGroup != (Group *)0x0) {
      (*(pGroup->super_FieldMap)._vptr_FieldMap[1])(pGroup);
    }
  }
  return;
}

Assistant:

void Message::setGroup(
    const std::string &msg,
    const FieldBase &field,
    const std::string &string,
    std::string::size_type &pos,
    FieldMap &map,
    const DataDictionary &dataDictionary) {
  int group = field.getTag();
  int delim;
  const DataDictionary *pDD = 0;
  if (!dataDictionary.getGroup(msg, group, delim, pDD)) {
    return;
  }
  std::unique_ptr<Group> pGroup;

  while (pos < string.size()) {
    std::string::size_type oldPos = pos;
    FieldBase field = extractField(string, pos, &dataDictionary, &dataDictionary, pGroup.get());

    // Start a new group because...
    if ( // found delimiter
        (field.getTag() == delim) ||
        // no delimiter, but field belongs to group OR field already processed
        (pDD->isField(field.getTag()) && (pGroup.get() == 0 || pGroup->isSetField(field.getTag())))) {
      if (pGroup.get()) {
        map.addGroupPtr(group, pGroup.release(), false);
      }
      pGroup.reset(new Group(field.getTag(), delim, pDD->getOrderedFields()));
    } else if (!pDD->isField(field.getTag())) {
      if (pGroup.get()) {
        map.addGroupPtr(group, pGroup.release(), false);
      }
      pos = oldPos;
      return;
    }

    if (!pGroup.get()) {
      return;
    }
    pGroup->addField(field);
    setGroup(msg, field, string, pos, *pGroup, *pDD);
  }
}